

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O0

bool __thiscall
cmSourceFileLocation::MatchesAmbiguousExtension
          (cmSourceFileLocation *this,cmSourceFileLocation *loc)

{
  __type _Var1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  char *str2;
  size_t N;
  cmake *this_00;
  bool local_aa;
  cmake *cm;
  cmMakefile *mf;
  string *local_28;
  string *ext;
  cmSourceFileLocation *loc_local;
  cmSourceFileLocation *this_local;
  
  ext = (string *)loc;
  loc_local = this;
  if (this->Makefile == (cmMakefile *)0x0) {
    __assert_fail("this->Makefile",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmSourceFileLocation.cxx"
                  ,0x8a,
                  "bool cmSourceFileLocation::MatchesAmbiguousExtension(const cmSourceFileLocation &) const"
                 );
  }
  _Var1 = std::operator==(&this->Name,&loc->Name);
  if (_Var1) {
    this_local._7_1_ = 1;
  }
  else {
    uVar3 = std::__cxx11::string::size();
    uVar4 = std::__cxx11::string::size();
    if (uVar4 < uVar3) {
      std::__cxx11::string::size();
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->Name);
      if (*pcVar5 == '.') {
        pcVar5 = (char *)std::__cxx11::string::c_str();
        str2 = (char *)std::__cxx11::string::c_str();
        N = std::__cxx11::string::size();
        bVar2 = cmHasLiteralPrefixImpl(pcVar5,str2,N);
        if (bVar2) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)&mf,(ulong)&this->Name);
          local_28 = (string *)&mf;
          this_00 = cmMakefile::GetCMakeInstance(this->Makefile);
          bVar2 = cmake::IsSourceExtension(this_00,local_28);
          local_aa = true;
          if (!bVar2) {
            local_aa = cmake::IsHeaderExtension(this_00,local_28);
          }
          this_local._7_1_ = local_aa;
          std::__cxx11::string::~string((string *)&mf);
          goto LAB_005006bc;
        }
      }
    }
    this_local._7_1_ = 0;
  }
LAB_005006bc:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmSourceFileLocation::MatchesAmbiguousExtension(
  cmSourceFileLocation const& loc) const
{
  assert(this->Makefile);
  // This location's extension is not ambiguous but loc's extension
  // is.  See if the names match as-is.
  if (this->Name == loc.Name) {
    return true;
  }

  // Check if loc's name could possibly be extended to our name by
  // adding an extension.
  if (!(this->Name.size() > loc.Name.size() &&
        this->Name[loc.Name.size()] == '.' &&
        cmHasLiteralPrefixImpl(this->Name.c_str(), loc.Name.c_str(),
                               loc.Name.size()))) {
    return false;
  }

  // Only a fixed set of extensions will be tried to match a file on
  // disk.  One of these must match if loc refers to this source file.
  std::string const& ext = this->Name.substr(loc.Name.size() + 1);
  cmMakefile const* mf = this->Makefile;
  auto cm = mf->GetCMakeInstance();
  return cm->IsSourceExtension(ext) || cm->IsHeaderExtension(ext);
}